

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeFunctionCall(ExpressionContext *ctx,SynFunctionCall *syntax)

{
  uint uVar1;
  InplaceStr name;
  undefined1 auVar2 [16];
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  IntrusiveList<TypeHandle> generics_02;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  bool bVar3;
  int iVar4;
  ExprBase *value;
  TypeBase *pTVar5;
  undefined4 extraout_var;
  long lVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExprSequence *this;
  VariableData *variable;
  ExprBase *pEVar8;
  _func_int **pp_Var9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  SynCallArgument *pSVar10;
  char *msg;
  SynCallArgument *pSVar11;
  ulong uVar12;
  SynBase *pSVar13;
  Allocator *pAVar14;
  IntrusiveList<SynIdentifier> path;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<FunctionValue> functions_02;
  ArrayView<FunctionValue> functions_03;
  ArrayView<FunctionValue> functions_04;
  ArrayView<FunctionValue> functions_05;
  IntrusiveList<ExprBase> arguments_2;
  IntrusiveList<TypeHandle> generics;
  ExprBase *call;
  ExprBase *definition;
  SmallArray<FunctionValue,_32U> functions;
  SmallArray<ArgumentData,_16U> arguments;
  undefined1 local_6f8 [32];
  ExprBase *local_6d8;
  Allocator *local_6d0;
  IntrusiveList<TypeHandle> local_6c8;
  ExprBase *local_6b0;
  ExprBase *local_6a8;
  ArgumentData *local_6a0;
  uint uStack_698;
  undefined4 uStack_694;
  ArgumentData *local_690;
  uint uStack_688;
  undefined4 uStack_684;
  ArgumentData *local_680;
  uint uStack_678;
  undefined4 uStack_674;
  ExprBase *local_670;
  undefined1 local_668 [784];
  Allocator *local_358;
  undefined1 auStack_350 [8];
  SmallArray<ArgumentData,_16U> local_348;
  TypeHandle *node;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  value = AnalyzeExpression(ctx,syntax->value);
  if ((value->type != (TypeBase *)0x0) && (value->type->typeID == 0)) {
    local_668._0_8_ = (ExprBase *)0x0;
    local_668._8_4_ = 0;
    local_668._12_4_ = 0;
    pSVar10 = (syntax->arguments).head;
    if (pSVar10 != (SynCallArgument *)0x0) {
      do {
        pEVar7 = AnalyzeExpression(ctx,pSVar10->value);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)local_668,pEVar7);
        pSVar10 = (SynCallArgument *)(pSVar10->super_SynBase).next;
        if (pSVar10 == (SynCallArgument *)0x0) break;
      } while ((pSVar10->super_SynBase).typeID == 0x18);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar7->typeID = 0x29;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar5;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240f18;
    pEVar7[1]._vptr_ExprBase = (_func_int **)value;
    *(undefined8 *)&pEVar7[1].typeID = local_668._0_8_;
    pEVar7[1].source = (SynBase *)CONCAT44(local_668._12_4_,local_668._8_4_);
    return pEVar7;
  }
  local_6c8.head = (TypeHandle *)0x0;
  local_6c8.tail = (TypeHandle *)0x0;
  pSVar13 = (syntax->aliases).head;
  if (pSVar13 != (SynBase *)0x0) {
    do {
      pTVar5 = AnalyzeType(ctx,pSVar13,true,(bool *)0x0);
      if (pTVar5 == ctx->typeAuto) {
        msg = "ERROR: explicit generic argument type can\'t be auto";
LAB_0017492f:
        anon_unknown.dwarf_c3752::Stop(ctx,&syntax->super_SynBase,msg);
      }
      if (pTVar5 == ctx->typeVoid) {
        msg = "ERROR: explicit generic argument cannot be a void type";
        goto LAB_0017492f;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      node = (TypeHandle *)CONCAT44(extraout_var,iVar4);
      node->type = pTVar5;
      node->next = (TypeHandle *)0x0;
      node->listed = false;
      IntrusiveList<TypeHandle>::push_back(&local_6c8,node);
      pSVar13 = pSVar13->next;
    } while (pSVar13 != (SynBase *)0x0);
  }
  pAVar14 = ctx->allocator;
  pEVar7 = (ExprBase *)(local_668 + 0x10);
  memset(pEVar7,0,0x300);
  local_668._8_4_ = 0;
  local_668._12_4_ = 0x20;
  lVar6 = 0x20;
  do {
    *(undefined8 *)(auStack_350 + lVar6 + -8) = 0;
    auStack_350[lVar6] = 0;
    *(undefined8 *)((long)local_348.little + lVar6 + -0x10) = 0;
    *(undefined8 *)((long)local_348.little + lVar6 + -8) = 0;
    *(undefined8 *)((long)&local_348.little[0].source + lVar6) = 0;
    *(undefined8 *)(&local_348.little[0].isExplicit + lVar6) = 0;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 800);
  local_348.data = local_348.little;
  pSVar10 = (SynCallArgument *)0x1000000000;
  local_348.count = 0;
  local_348.max = 0x10;
  local_668._0_8_ = pEVar7;
  local_358 = pAVar14;
  local_348.allocator = pAVar14;
  if ((value != (ExprBase *)0x0) && (value->typeID == 8)) {
    pp_Var9 = value[1]._vptr_ExprBase;
    if (pp_Var9 != (_func_int **)0x0) {
      uVar1 = *(uint *)(pp_Var9 + 1);
      pSVar10 = (SynCallArgument *)(ulong)uVar1;
      if (uVar1 == 0) {
        local_6f8._0_8_ = (ExprBase *)0x0;
        local_6f8._8_4_ = 0;
        local_6f8._12_4_ = 0;
        pSVar10 = (syntax->arguments).head;
        if (pSVar10 != (SynCallArgument *)0x0) {
          do {
            pEVar7 = AnalyzeExpression(ctx,pSVar10->value);
            IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)local_6f8,pEVar7);
            pSVar10 = (SynCallArgument *)(pSVar10->super_SynBase).next;
            if (pSVar10 == (SynCallArgument *)0x0) break;
          } while ((pSVar10->super_SynBase).typeID == 0x18);
          pAVar14 = ctx->allocator;
        }
        iVar4 = (*pAVar14->_vptr_Allocator[2])(pAVar14,0x48);
        this = (ExprSequence *)CONCAT44(extraout_var_02,iVar4);
        pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
LAB_0017424f:
        (this->super_ExprBase).typeID = 0x29;
        (this->super_ExprBase).source = &syntax->super_SynBase;
        (this->super_ExprBase).type = pTVar5;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240f18;
        (this->expressions).data = (ExprBase **)value;
        (this->expressions).count = local_6f8._0_4_;
        (this->expressions).max = local_6f8._4_4_;
        (this->expressions).little[0] = (ExprBase *)CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
        goto LAB_0017451f;
      }
      if (uVar1 == 0x18) {
        if (*(char *)(pp_Var9 + 0x24) == '\0') {
          anon_unknown.dwarf_c3752::Report
                    (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                     (ulong)(uint)(*(int *)(pp_Var9 + 3) - (int)pp_Var9[2]));
          local_6f8._0_8_ = (ExprBase *)0x0;
          local_6f8._8_4_ = 0;
          local_6f8._12_4_ = 0;
          pSVar10 = (syntax->arguments).head;
          if (pSVar10 != (SynCallArgument *)0x0) {
            do {
              pEVar7 = AnalyzeExpression(ctx,pSVar10->value);
              IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)local_6f8,pEVar7);
              pSVar10 = (SynCallArgument *)(pSVar10->super_SynBase).next;
              if (pSVar10 == (SynCallArgument *)0x0) break;
            } while ((pSVar10->super_SynBase).typeID == 0x18);
          }
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          this = (ExprSequence *)CONCAT44(extraout_var_00,iVar4);
          pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          goto LAB_0017424f;
        }
      }
      else if (((uVar1 == 0x1c) && (local_6c8.head == (TypeHandle *)0x0)) &&
              (pSVar10 = (syntax->arguments).head, pSVar10 != (SynCallArgument *)0x0)) {
        iVar4 = 1;
        pSVar11 = pSVar10;
        do {
          pSVar11 = (SynCallArgument *)(pSVar11->super_SynBase).next;
          iVar4 = iVar4 + -1;
        } while (pSVar11 != (SynCallArgument *)0x0);
        if (((iVar4 == 0) && (pSVar10->name == (SynIdentifier *)0x0)) &&
           ((pSVar13 = pSVar10->value, pSVar13 != (SynBase *)0x0 &&
            ((pSVar13->typeID == 7 && (pSVar13[1]._vptr_SynBase == (_func_int **)0x0)))))) {
          lVar6 = *(long *)(pp_Var9[0xc] + 0x68);
          if (lVar6 != 0) {
            do {
              bVar3 = InplaceStr::operator==
                                ((InplaceStr *)(*(long *)(*(long *)(lVar6 + 8) + 0x28) + 0x40),
                                 (InplaceStr *)&pSVar13[1].begin);
              if (bVar3) {
                iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                this = (ExprSequence *)CONCAT44(extraout_var_08,iVar4);
                pTVar5 = ctx->typeBool;
                (this->super_ExprBase).typeID = 3;
                (this->super_ExprBase).source = &syntax->super_SynBase;
                (this->super_ExprBase).type = pTVar5;
                (this->super_ExprBase).next = (ExprBase *)0x0;
                *(undefined2 *)&(this->super_ExprBase).listed = 0x100;
                goto LAB_0017490f;
              }
              lVar6 = *(long *)(lVar6 + 0x18);
            } while (lVar6 != 0);
            pAVar14 = ctx->allocator;
          }
          iVar4 = (*pAVar14->_vptr_Allocator[2])(pAVar14,0x30);
          this = (ExprSequence *)CONCAT44(extraout_var_07,iVar4);
          pTVar5 = ctx->typeBool;
          (this->super_ExprBase).typeID = 3;
          (this->super_ExprBase).source = &syntax->super_SynBase;
          (this->super_ExprBase).type = pTVar5;
          (this->super_ExprBase).next = (ExprBase *)0x0;
          *(undefined2 *)&(this->super_ExprBase).listed = 0;
LAB_0017490f:
          (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240490;
          goto LAB_0017451f;
        }
      }
    }
    pSVar13 = syntax->value;
    if ((pSVar13 == (SynBase *)0x0) || (pSVar13->typeID != 7)) {
LAB_00174314:
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pSVar10;
      pEVar7 = CreateVariableAccess
                         (ctx,pSVar13,(IntrusiveList<SynIdentifier>)(auVar2 << 0x40),
                          *(InplaceStr *)(pp_Var9 + 2),false);
      if (pEVar7 != (ExprBase *)0x0) {
LAB_00174339:
        local_668._8_4_ = 0;
        GetNodeFunctions(ctx,&syntax->super_SynBase,pEVar7,
                         (SmallArray<FunctionValue,_32U> *)local_668);
        uVar12 = (ulong)(uint)local_668._8_4_;
        if (uVar12 != 0) {
          lVar6 = 0;
          do {
            if (*(TypeBase **)
                 (*(long *)(*(long *)((long)(local_668._0_8_ + 8) + lVar6) + 0x28) + 0x60) !=
                ctx->typeVoid) {
              if (local_348.count == 0) {
                AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&local_348);
                uVar12 = (ulong)(uint)local_668._8_4_;
              }
              functions_00._8_8_ = uVar12;
              functions_00.data = (FunctionValue *)local_668._0_8_;
              AnalyzeFunctionArgumentsFinal
                        (ctx,&syntax->super_SynBase,value,functions_00,(syntax->arguments).head,
                         &local_348);
              functions_01.count = local_668._8_4_;
              functions_01.data = (FunctionValue *)local_668._0_8_;
              local_680 = local_348.data;
              uStack_678 = local_348.count;
              arguments_00._12_4_ = uStack_674;
              arguments_00.count = local_348.count;
              generics_00.tail = local_6c8.tail;
              generics_00.head = local_6c8.head;
              arguments_00.data = local_348.data;
              functions_01._12_4_ = 0;
              this = (ExprSequence *)
                     CreateFunctionCallFinal
                               (ctx,&syntax->super_SynBase,value,functions_01,generics_00,
                                arguments_00,true);
              if (this != (ExprSequence *)0x0) goto LAB_0017451f;
              break;
            }
            lVar6 = lVar6 + 0x18;
          } while (uVar12 * 0x18 != lVar6);
        }
      }
    }
    else {
      name.begin = (char *)pSVar13[1].begin;
      name.end = (char *)pSVar13[1].end;
      path.tail = (SynIdentifier *)pSVar10;
      path.head = (SynIdentifier *)pSVar13[1]._vptr_SynBase;
      pEVar7 = CreateVariableAccess(ctx,pSVar13,path,name,false);
      if (pEVar7 != (ExprBase *)0x0) goto LAB_00174339;
      if (pSVar13[1]._vptr_SynBase == (_func_int **)0x0) {
        pSVar13 = syntax->value;
        pp_Var9 = value[1]._vptr_ExprBase;
        goto LAB_00174314;
      }
    }
    if (((TypeBase *)value[1]._vptr_ExprBase)->isGeneric == false) {
      variable = anon_unknown.dwarf_c3752::AllocateTemporary
                           (ctx,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase);
      pEVar7 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
      pEVar7 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar7);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_03,iVar4);
      pTVar5 = ctx->typeVoid;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
      pp_Var9 = (_func_int **)CONCAT44(extraout_var_04,iVar4);
      *pp_Var9 = (_func_int *)0x0;
      pp_Var9[1] = (_func_int *)variable;
      pp_Var9[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var9 + 3) = 0;
      pEVar8->typeID = 0x1e;
      pEVar8->source = &syntax->super_SynBase;
      pEVar8->type = pTVar5;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
      pEVar8[1]._vptr_ExprBase = pp_Var9;
      *(undefined8 *)&pEVar8[1].typeID = 0;
      local_6a8 = pEVar8;
      pEVar7 = CreateConstructorAccess
                         (ctx,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase,
                          (syntax->arguments).head == (SynCallArgument *)0x0,pEVar7);
      if (pEVar7 != (ExprBase *)0x0) {
        local_668._8_4_ = 0;
        GetNodeFunctions(ctx,&syntax->super_SynBase,pEVar7,
                         (SmallArray<FunctionValue,_32U> *)local_668);
        if (local_348.count == 0) {
          AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&local_348);
        }
        functions_04.count = local_668._8_4_;
        functions_04.data = (FunctionValue *)local_668._0_8_;
        functions_04._12_4_ = 0;
        AnalyzeFunctionArgumentsFinal
                  (ctx,&syntax->super_SynBase,value,functions_04,(syntax->arguments).head,&local_348
                  );
        functions_05.count = local_668._8_4_;
        functions_05.data = (FunctionValue *)local_668._0_8_;
        local_690 = local_348.data;
        uStack_688 = local_348.count;
        arguments_02._12_4_ = uStack_684;
        arguments_02.count = local_348.count;
        generics_02.tail = local_6c8.tail;
        generics_02.head = local_6c8.head;
        arguments_02.data = local_348.data;
        functions_05._12_4_ = 0;
        local_6b0 = CreateFunctionCallFinal
                              (ctx,&syntax->super_SynBase,value,functions_05,generics_02,
                               arguments_02,false);
        local_6d0 = ctx->allocator;
        local_6f8._0_8_ = local_6f8 + 0x10;
        local_6f8._8_4_ = 0;
        local_6f8._12_4_ = 3;
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_6f8,&local_6a8);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_6f8,&local_6b0);
        local_670 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_6f8,&local_670);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprSequence *)CONCAT44(extraout_var_05,iVar4);
        arr.count = local_6f8._8_4_;
        arr.data = (ExprBase **)local_6f8._0_8_;
        arr._12_4_ = 0;
        ExprSequence::ExprSequence
                  (this,ctx->allocator,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase,
                   arr);
        SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_6f8);
        goto LAB_0017451f;
      }
      if ((syntax->arguments).head == (SynCallArgument *)0x0) {
        local_6d8 = (ExprBase *)ctx->allocator;
        local_6f8._0_8_ = local_6f8 + 0x10;
        local_6f8._8_4_ = 0;
        local_6f8._12_4_ = 2;
        SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)local_6f8,&local_6a8);
        local_6b0 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
        SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)local_6f8,&local_6b0);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprSequence *)CONCAT44(extraout_var_06,iVar4);
        arr_00.count = local_6f8._8_4_;
        arr_00.data = (ExprBase **)local_6f8._0_8_;
        arr_00._12_4_ = 0;
        ExprSequence::ExprSequence
                  (this,ctx->allocator,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase,
                   arr_00);
        SmallArray<ExprBase_*,_2U>::~SmallArray((SmallArray<ExprBase_*,_2U> *)local_6f8);
        goto LAB_0017451f;
      }
    }
  }
  local_668._8_4_ = 0;
  GetNodeFunctions(ctx,&syntax->super_SynBase,value,(SmallArray<FunctionValue,_32U> *)local_668);
  if (local_348.count == 0) {
    AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&local_348);
  }
  functions_02.count = local_668._8_4_;
  functions_02.data = (FunctionValue *)local_668._0_8_;
  functions_02._12_4_ = 0;
  AnalyzeFunctionArgumentsFinal
            (ctx,&syntax->super_SynBase,value,functions_02,(syntax->arguments).head,&local_348);
  functions_03.count = local_668._8_4_;
  functions_03.data = (FunctionValue *)local_668._0_8_;
  local_6a0 = local_348.data;
  uStack_698 = local_348.count;
  arguments_01._12_4_ = uStack_694;
  arguments_01.count = local_348.count;
  generics_01.tail = local_6c8.tail;
  generics_01.head = local_6c8.head;
  arguments_01.data = local_348.data;
  functions_03._12_4_ = 0;
  this = (ExprSequence *)
         CreateFunctionCallFinal
                   (ctx,&syntax->super_SynBase,value,functions_03,generics_01,arguments_01,false);
LAB_0017451f:
  SmallArray<ArgumentData,_16U>::~SmallArray(&local_348);
  SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_668);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeFunctionCall(ExpressionContext &ctx, SynFunctionCall *syntax)
{
	ExprBase *function = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(function->type))
	{
		IntrusiveList<ExprBase> arguments;

		for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
			arguments.push_back(AnalyzeExpression(ctx, el->value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
	}

	IntrusiveList<TypeHandle> generics;

	for(SynBase *curr = syntax->aliases.head; curr; curr = curr->next)
	{
		TypeBase *type = AnalyzeType(ctx, curr);

		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: explicit generic argument type can't be auto");

		if(type == ctx.typeVoid)
			Stop(ctx, syntax, "ERROR: explicit generic argument cannot be a void type");

		generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
	}

	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);
	SmallArray<ArgumentData, 16> arguments(ctx.allocator);

	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(function))
	{
		if(TypeClass *typeClass = getType<TypeClass>(type->value))
		{
			if(!typeClass->completed)
			{
				Report(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(typeClass->name));

				IntrusiveList<ExprBase> arguments;

				for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
					arguments.push_back(AnalyzeExpression(ctx, el->value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
			}
		}

		if(isType<TypeError>(type->value))
		{
			IntrusiveList<ExprBase> arguments;

			for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
				arguments.push_back(AnalyzeExpression(ctx, el->value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
		}

		// Handle hasMember(x) expresion
		if(TypeMemberSet *memberSet = getType<TypeMemberSet>(type->value))
		{
			if(generics.empty() && syntax->arguments.size() == 1 && !syntax->arguments.head->name)
			{
				if(SynTypeSimple *name = getType<SynTypeSimple>(syntax->arguments.head->value))
				{
					if(name->path.empty())
					{
						for(MemberHandle *curr = memberSet->type->members.head; curr; curr = curr->next)
						{
							if(curr->variable->name->name == name->name)
								return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, true);
						}

						return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, false);
					}
				}
			}
		}

		ExprBase *regular = NULL;

		if(SynTypeSimple *node = getType<SynTypeSimple>(syntax->value))
		{
			regular = CreateVariableAccess(ctx, syntax->value, node->path, node->name, false);

			if(!regular && node->path.empty())
				regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}
		else
		{
			regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}

		if(regular)
		{
			// Collect a set of available functions
			functions.clear();
			GetNodeFunctions(ctx, syntax, regular, functions);

			// If only constructors are available, do not call as a regular function
			bool hasReturnValue = false;

			for(unsigned i = 0; i < functions.size(); i++)
			{
				if(functions[i].function->type->returnType != ctx.typeVoid)
				{
					hasReturnValue = true;
					break;
				}
			}

			if(hasReturnValue)
			{
				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, true);

				if(call)
					return call;
			}
		}

		if(!type->value->isGeneric)
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, type->value);

			ExprBase *pointer = CreateGetAddress(ctx, syntax, CreateVariableAccess(ctx, syntax, variable, false));

			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), NULL);

			ExprBase *constructor = CreateConstructorAccess(ctx, syntax, type->value, syntax->arguments.empty(), pointer);

			if(!constructor && syntax->arguments.empty())
			{
				SmallArray<ExprBase*, 2> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}

			if(constructor)
			{
				// Collect a set of available functions
				functions.clear();
				GetNodeFunctions(ctx, syntax, constructor, functions);

				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);

				SmallArray<ExprBase*, 3> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(call);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}
		}
	}

	// Collect a set of available functions
	functions.clear();
	GetNodeFunctions(ctx, syntax, function, functions);

	if(arguments.empty())
		AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

	AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

	return CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);
}